

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint64_t roaring_bitmap_rank(roaring_bitmap_t *bm,uint32_t x)

{
  ushort uVar1;
  uint uVar2;
  ushort x_00;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  uint64_t uVar6;
  uint uVar7;
  ulong uVar8;
  run_container_t *prVar9;
  long lVar10;
  
  iVar5 = (bm->high_low_container).size;
  if (iVar5 < 1) {
    return 0;
  }
  x_00 = (ushort)x;
  lVar10 = 0;
  uVar6 = 0;
  while (uVar7 = (uint)(bm->high_low_container).keys[lVar10], uVar7 < x >> 0x10) {
    prVar9 = (run_container_t *)(bm->high_low_container).containers[lVar10];
    uVar3 = (bm->high_low_container).typecodes[lVar10];
    if (uVar3 == '\x04') {
      uVar3 = *(uint8_t *)&prVar9->runs;
      prVar9 = *(run_container_t **)prVar9;
    }
    if (uVar3 == '\x03') {
      iVar4 = run_container_cardinality(prVar9);
      iVar5 = (bm->high_low_container).size;
    }
    else {
      iVar4 = prVar9->n_runs;
    }
    uVar6 = uVar6 + (long)iVar4;
    lVar10 = lVar10 + 1;
    if (iVar5 <= lVar10) {
      return uVar6;
    }
  }
  if (x >> 0x10 != uVar7) {
    return uVar6;
  }
  prVar9 = (run_container_t *)(bm->high_low_container).containers[lVar10];
  uVar3 = (bm->high_low_container).typecodes[lVar10];
  if (uVar3 == '\x04') {
    uVar3 = *(uint8_t *)&prVar9->runs;
    prVar9 = *(run_container_t **)prVar9;
  }
  if (uVar3 == '\x03') {
    iVar5 = run_container_rank(prVar9,x_00);
  }
  else if (uVar3 == '\x02') {
    if (0 < prVar9->n_runs) {
      iVar5 = prVar9->n_runs + -1;
      uVar7 = 0;
      do {
        uVar2 = iVar5 + uVar7 >> 1;
        uVar1 = *(ushort *)((long)&prVar9->runs->value + (ulong)(iVar5 + uVar7 & 0xfffffffe));
        if (uVar1 < x_00) {
          uVar7 = uVar2 + 1;
        }
        else {
          if (uVar1 <= x_00) {
            uVar2 = uVar2 + 1;
            goto LAB_0010a13e;
          }
          iVar5 = uVar2 - 1;
        }
      } while ((int)uVar7 <= iVar5);
      uVar2 = -uVar7;
      if (0 < (int)uVar7) {
        uVar2 = uVar7;
      }
LAB_0010a13e:
      uVar8 = (ulong)uVar2;
      goto LAB_0010a140;
    }
    iVar5 = 0;
  }
  else {
    iVar5 = bitset_container_rank((bitset_container_t *)prVar9,x_00);
  }
  uVar8 = (ulong)iVar5;
LAB_0010a140:
  return uVar6 + uVar8;
}

Assistant:

uint64_t roaring_bitmap_rank(const roaring_bitmap_t *bm, uint32_t x) {
    uint64_t size = 0;
    uint32_t xhigh = x >> 16;
    for (int i = 0; i < bm->high_low_container.size; i++) {
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            size +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
        } else if (xhigh == key) {
            return size + container_rank(bm->high_low_container.containers[i],
                                         bm->high_low_container.typecodes[i],
                                         x & 0xFFFF);
        } else {
            return size;
        }
    }
    return size;
}